

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeChain::ContinueChainDefaultCallback
               (ON__UINT_PTR continue_condition,ON_SubDEdgePtr left_eptr,ON_SubDEdgePtr right_eptr)

{
  ON_SubDVertexTag OVar1;
  ON_SubDVertex *pOVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ON_SubDEdge *this;
  ON_SubDEdge *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  bool local_be;
  bool local_bd;
  ON_SubDFace *f1 [2];
  ON_SubDFace *f0 [2];
  bool bPass;
  ON_SubDEdgeSharpness OStack_78;
  ON_SubDVertexTag vtag;
  ON_SubDEdgeSharpness local_70;
  ON_SubDVertex *local_68;
  ON_SubDVertex *v1 [2];
  uint e1dir;
  ON_SubDEdge *e1;
  ON_SubDVertex *v0 [2];
  uint e0dir;
  ON_SubDEdge *e0;
  ON__UINT_PTR continue_condition_local;
  ON_SubDEdgePtr right_eptr_local;
  ON_SubDEdgePtr left_eptr_local;
  
  this = (ON_SubDEdge *)(left_eptr.m_ptr & 0xfffffffffffffff8);
  if (this == (ON_SubDEdge *)0x0) {
    left_eptr_local.m_ptr._7_1_ = false;
  }
  else {
    uVar5 = (uint)left_eptr.m_ptr & 1;
    pOVar2 = this->m_vertex[1 - uVar5];
    if ((this->m_vertex[uVar5] == (ON_SubDVertex *)0x0) || (pOVar2 == (ON_SubDVertex *)0x0)) {
      left_eptr_local.m_ptr._7_1_ = false;
    }
    else if (this->m_vertex[uVar5] == pOVar2) {
      left_eptr_local.m_ptr._7_1_ = false;
    }
    else {
      this_00 = (ON_SubDEdge *)(right_eptr.m_ptr & 0xfffffffffffffff8);
      if (this_00 == (ON_SubDEdge *)0x0) {
        left_eptr_local.m_ptr._7_1_ = false;
      }
      else if (this == this_00) {
        left_eptr_local.m_ptr._7_1_ = false;
      }
      else {
        v1[1]._4_4_ = (uint)right_eptr.m_ptr & 1;
        local_68 = this_00->m_vertex[v1[1]._4_4_];
        v1[0] = this_00->m_vertex[1 - v1[1]._4_4_];
        if (pOVar2 == local_68) {
          if (v1[0] == (ON_SubDVertex *)0x0) {
            left_eptr_local.m_ptr._7_1_ = false;
          }
          else if (local_68 == v1[0]) {
            left_eptr_local.m_ptr._7_1_ = false;
          }
          else if (continue_condition == 0) {
            left_eptr_local.m_ptr._7_1_ = true;
          }
          else if (((continue_condition & 1) == 0) || (this->m_face_count == this_00->m_face_count))
          {
            if ((continue_condition & 4) != 0) {
              bVar3 = ON_SubDEdge::IsSharp(this);
              bVar4 = ON_SubDEdge::IsSharp(this_00);
              if (bVar3 != bVar4) {
                return false;
              }
            }
            if ((continue_condition & 8) != 0) {
              local_70 = ON_SubDEdge::Sharpness(this,true);
              dVar10 = ON_SubDEdgeSharpness::EndSharpness(&local_70,1 - uVar5);
              OStack_78 = ON_SubDEdge::Sharpness(this_00,true);
              dVar11 = ON_SubDEdgeSharpness::EndSharpness(&stack0xffffffffffffff88,v1[1]._4_4_);
              if (dVar10 != dVar11) {
                return false;
              }
            }
            if ((continue_condition & 0xf0) != 0) {
              OVar1 = pOVar2->m_vertex_tag;
              bVar3 = (continue_condition & 0x10) != 0;
              local_bd = bVar3 && OVar1 == Smooth;
              if (!bVar3 || OVar1 != Smooth) {
                local_be = (continue_condition & 0x20) != 0 && OVar1 == Crease;
                local_bd = local_be;
              }
              if (!local_bd) {
                local_bd = (continue_condition & 0x40) != 0 && OVar1 == Dart;
              }
              if (!local_bd) {
                local_bd = (continue_condition & 0x80) != 0 && OVar1 == Corner;
              }
              if (!local_bd) {
                return false;
              }
            }
            if ((((continue_condition & 0x100) != 0) && (pOVar2->m_edge_count == 4)) &&
               (pOVar2->m_face_count == 4)) {
              uVar6 = this->m_face2[0].m_ptr & 0xfffffffffffffff8;
              uVar7 = this->m_face2[1].m_ptr & 0xfffffffffffffff8;
              if ((uVar6 == 0) || (uVar7 == 0)) {
                return false;
              }
              uVar8 = this_00->m_face2[0].m_ptr & 0xfffffffffffffff8;
              uVar9 = this_00->m_face2[1].m_ptr & 0xfffffffffffffff8;
              if ((uVar8 == 0) || (uVar9 == 0)) {
                return false;
              }
              if ((((uVar6 == uVar8) || (uVar6 == uVar9)) || (uVar7 == uVar8)) || (uVar7 == uVar9))
              {
                return false;
              }
            }
            left_eptr_local.m_ptr._7_1_ = true;
          }
          else {
            left_eptr_local.m_ptr._7_1_ = false;
          }
        }
        else {
          left_eptr_local.m_ptr._7_1_ = false;
        }
      }
    }
  }
  return left_eptr_local.m_ptr._7_1_;
}

Assistant:

bool ON_SubDEdgeChain::ContinueChainDefaultCallback(
  ON__UINT_PTR continue_condition,
  ON_SubDEdgePtr left_eptr,
  ON_SubDEdgePtr right_eptr
)
{
  // Perform edge chain topology check
  const ON_SubDEdge* e0 = ON_SUBD_EDGE_POINTER(left_eptr.m_ptr);
  if (nullptr == e0)
    return false;
  const unsigned e0dir = (unsigned)(left_eptr.m_ptr & 1U);
  const ON_SubDVertex* v0[2] = { e0->m_vertex[e0dir], e0->m_vertex[1-e0dir] } ;
  if (nullptr == v0[0] || nullptr == v0[1])
    return false;
  if (v0[0] == v0[1])
    return false;
  const ON_SubDEdge* e1 = ON_SUBD_EDGE_POINTER(right_eptr.m_ptr);
  if (nullptr == e1)
    return false;
  // edges must be distinct
  if (e0 == e1)
    return false;
  // edges must have a common middle vertex
  const unsigned e1dir = (unsigned)(right_eptr.m_ptr & 1);
  const ON_SubDVertex* v1[2] = { e1->m_vertex[e1dir], e1->m_vertex[1 - e1dir] };
  if (v0[1] != v1[0])
    return false;
  if (nullptr == v1[1])
    return false;
  if (v1[0] == v1[1])
    return false;

  // edge chain topology check passed.
  if (0 == continue_condition)
    return true;

  if (0 != (continue_condition & 1))
  {
    // same face count check
    if (e0->m_face_count != e1->m_face_count)
      return false;
  }

  if (0 != (continue_condition & 4))
  {
    // same smooth / crease property
    if (e0->IsSharp() != e1->IsSharp())
      return false;
  }

  if (0 != (continue_condition & 8))
  {
    // equal sharpness at the common vertex check
    if ( false == (e0->Sharpness(true).EndSharpness(1-e0dir) == e1->Sharpness(true).EndSharpness(e1dir)))
      return false;
  }

  while (0 != (continue_condition & (16+32+64+128)))
  {
    // vertex tag filter
    const ON_SubDVertexTag vtag = v0[1]->m_vertex_tag;
    bool bPass = (0 != (continue_condition & 16) && ON_SubDVertexTag::Smooth == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 32) && ON_SubDVertexTag::Crease == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 64) && ON_SubDVertexTag::Dart == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 128) && ON_SubDVertexTag::Corner == vtag);

    if (false == bPass)
      return false;

    break;
  }

  if (0 != (continue_condition & 256) && 4 == v0[1]->m_edge_count && 4 == v0[1]->m_face_count)
  {
    // opposite interior crease check
    const ON_SubDFace* f0[2] = { ON_SUBD_FACE_POINTER(e0->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e0->m_face2[1].m_ptr) };
    if (nullptr == f0[0] || nullptr == f0[1])
      return false;
    const ON_SubDFace* f1[2] = { ON_SUBD_FACE_POINTER(e1->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e1->m_face2[1].m_ptr) };
    if (nullptr == f1[0] || nullptr == f1[1])
      return false;
    if (f0[0] == f1[0] || f0[0] == f1[1] || f0[1] == f1[0] || f0[1] == f1[1])
      return false; // the edges share a face
  }

  // All checks passed
  return true;
}